

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::inc_mhl(CPU *this)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint8_t val;
  
  uVar1._0_1_ = this->regs->h;
  uVar1._1_1_ = this->regs->l;
  uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)uVar3);
  val = (uint8_t)iVar2;
  inc_r8(this,&val);
  (*this->mmu->_vptr_IMmu[2])(this->mmu,(ulong)uVar3,(ulong)val);
  return 3;
}

Assistant:

int CPU::inc_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    uint8_t val = mmu.read_byte(addr);

    // CHECK
    inc_r8(val);

    mmu.write_byte(addr, val);
    return 3;
}